

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

int pr_cust(customer_t *c,int mode)

{
  int len;
  long tmp;
  long local_10;
  
  if (pr_cust::fp == (FILE *)0x0) {
    pr_cust::fp = print_prep(3,0);
  }
  local_10 = c->custkey;
  dbg_print(2,pr_cust::fp,&local_10,0,1);
  dbg_print(0,pr_cust::fp,c->name,0x19,1);
  len = 0x18;
  if (columnar == 0) {
    len = c->alen;
  }
  dbg_print(0,pr_cust::fp,c->address,len,1);
  dbg_print(0,pr_cust::fp,c->city,10,1);
  dbg_print(0,pr_cust::fp,c->nation_name,0xf,1);
  dbg_print(0,pr_cust::fp,c->region_name,0xc,1);
  dbg_print(0,pr_cust::fp,c->phone,0xf,1);
  dbg_print(0,pr_cust::fp,c->mktsegment,0xf,0);
  fputc(10,(FILE *)pr_cust::fp);
  return 0;
}

Assistant:

int
pr_cust(customer_t *c, int mode)
{
static FILE *fp = NULL;

   UNUSED(mode);
   if (fp == NULL)
        fp = print_prep(CUST, 0);

   PR_STRT(fp);
   PR_INT(fp, c->custkey);
   PR_VSTR(fp, c->name, C_NAME_LEN);
   PR_VSTR(fp, c->address, 
       (columnar)?(long)(ceil(C_ADDR_LEN * V_STR_HGH)):c->alen);
   PR_STR(fp, c->city,CITY_FIX);
   PR_STR(fp, c->nation_name, C_NATION_NAME_LEN);
   PR_STR(fp, c->region_name, C_REGION_NAME_LEN);
   PR_STR(fp, c->phone, PHONE_LEN);
   PR_VSTR_LAST(fp, c->mktsegment,MAXAGG_LEN);
   PR_END(fp);

   return(0);
}